

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_subquery_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,SubqueryExpression *expr,
          idx_t depth)

{
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *this_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_00
  ;
  SubqueryType SVar1;
  ExpressionType EVar2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var7;
  undefined8 uVar8;
  idx_t iVar9;
  bool bVar10;
  pointer pSVar11;
  pointer pQVar12;
  Binder *pBVar13;
  reference pvVar14;
  BoundSubqueryNode *pBVar15;
  type expr_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer pBVar16;
  reference pvVar17;
  reference this_01;
  type expr_02;
  pointer pBVar18;
  BinderException *pBVar19;
  ulong uVar20;
  pointer *__ptr;
  unsigned_long params_1;
  _Head_base<0UL,_duckdb::BoundSubqueryExpression_*,_false> local_228;
  SubqueryExpression *local_220;
  allocator local_211;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> local_210;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  child_expressions;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d8;
  BindResult *local_1d0;
  LogicalType child_type;
  LogicalType return_type;
  shared_ptr<duckdb::Binder,_true> local_198;
  CorrelatedColumnInfo corr;
  LogicalType local_100;
  string local_e8;
  LogicalType compare_type;
  ErrorData local_b0;
  
  this_00 = &expr->subquery;
  local_220 = expr;
  local_1d0 = __return_storage_ptr__;
  pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->(this_00);
  pQVar12 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                      (&pSVar11->node);
  if (pQVar12->type != BOUND_SUBQUERY_NODE) {
    Binder::CreateBinder((Binder *)&child_expressions,this->context,this->binder,REGULAR_BINDER);
    pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)&child_expressions);
    pBVar13->can_contain_nulls = true;
    pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)&child_expressions);
    pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(this_00);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
              (&pSVar11->node);
    Binder::BindNode((Binder *)&return_type,(QueryNode *)pBVar13);
    for (uVar20 = 0;
        pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)&child_expressions),
        uVar20 < (ulong)(((long)(pBVar13->correlated_columns).
                                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                .
                                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar13->correlated_columns).
                               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                               .
                               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x50);
        uVar20 = uVar20 + 1) {
      pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&child_expressions);
      pvVar14 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>
                          (&pBVar13->correlated_columns,uVar20);
      CorrelatedColumnInfo::CorrelatedColumnInfo(&corr,pvVar14);
      if (1 < corr.depth) {
        corr.depth = corr.depth - 1;
        Binder::AddCorrelatedColumn(this->binder,&corr);
      }
      CorrelatedColumnInfo::~CorrelatedColumnInfo(&corr);
    }
    corr.binding.table_index =
         (idx_t)(this_00->
                super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
    make_uniq<duckdb::SelectStatement>();
    uVar8 = child_type._0_8_;
    child_type.id_ = INVALID;
    child_type.physical_type_ = ~INVALID;
    child_type._2_6_ = 0;
    _Var3._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar8
    ;
    if ((_Var3._M_head_impl != (SelectStatement *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))(),
       child_type._0_8_ != 0)) {
      (**(code **)(*(long *)child_type._0_8_ + 8))();
    }
    make_uniq<duckdb::BoundSubqueryNode,duckdb::shared_ptr<duckdb::Binder,true>,duckdb::unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>,true>,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
              ((duckdb *)&child_type,(shared_ptr<duckdb::Binder,_true> *)&child_expressions,
               (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                *)&return_type,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&corr);
    uVar8 = child_type._0_8_;
    child_type.id_ = INVALID;
    child_type.physical_type_ = ~INVALID;
    child_type._2_6_ = 0;
    pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(this_00);
    _Var4._M_head_impl =
         (pSVar11->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar11->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar8;
    if (_Var4._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if (child_type._0_8_ != 0) {
      (**(code **)(*(long *)child_type._0_8_ + 8))();
    }
    if (corr.binding.table_index != 0) {
      (**(code **)(*(long *)corr.binding.table_index + 8))();
    }
    if ((long *)CONCAT71(return_type._1_7_,return_type.id_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(return_type._1_7_,return_type.id_) + 8))();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &child_expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  expr_00 = &local_220->child;
  if ((local_220->child).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    Bind((ErrorData *)&corr,this,expr_00,depth,false);
    if ((char)corr.binding.table_index == '\x01') {
      ErrorData::ErrorData(&local_b0,(ErrorData *)&corr);
      BindResult::BindResult(local_1d0,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      ErrorData::~ErrorData((ErrorData *)&corr);
      return local_1d0;
    }
    ErrorData::~ErrorData((ErrorData *)&corr);
  }
  pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->(this_00);
  pQVar12 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                      (&pSVar11->node);
  pBVar15 = QueryNode::Cast<duckdb::BoundSubqueryNode>(pQVar12);
  child_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  child_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_220->subquery_type == EXISTS) {
    bVar10 = false;
  }
  else {
    if ((expr_00->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
        (ParsedExpression *)0x0) {
      params_1 = 1;
    }
    else {
      expr_01 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr_00);
      child = BoundExpression::GetExpression(expr_01);
      pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar15->bound_node);
      ExtractSubqueryChildren(child,&child_expressions,&pBVar16->types);
      if (child_expressions.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          child_expressions.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&child_expressions,child);
      }
      params_1 = (long)child_expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)child_expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar15->bound_node);
    if (((long)(pBVar16->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)(pBVar16->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 != params_1) {
      pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&corr,"Subquery returns %zu columns - expected %d",
                 (allocator *)&return_type);
      pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar15->bound_node);
      BinderException::BinderException<unsigned_long,unsigned_long>
                (pBVar19,&local_220->super_ParsedExpression,(string *)&corr,
                 ((long)(pBVar16->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pBVar16->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,params_1);
      __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar10 = local_220->subquery_type == SCALAR;
  }
  local_198.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pBVar15->subquery_binder).internal.
       super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_198.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (pBVar15->subquery_binder).internal.
          super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar15->subquery_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pBVar15->subquery_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_210._M_head_impl =
       (pBVar15->bound_node).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar15->bound_node).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)0x0;
  if (bVar10) {
    pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)&local_210);
    pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar16->types,0);
    LogicalType::LogicalType(&return_type,pvVar17);
  }
  else {
    LogicalType::LogicalType(&return_type,BOOLEAN);
  }
  if (return_type.id_ == UNKNOWN) {
    LogicalType::LogicalType((LogicalType *)&corr,SQLNULL);
    LogicalType::operator=(&return_type,(LogicalType *)&corr);
    LogicalType::~LogicalType((LogicalType *)&corr);
  }
  make_uniq<duckdb::BoundSubqueryExpression,duckdb::LogicalType&>((duckdb *)&local_228,&return_type)
  ;
  if (local_220->subquery_type == ANY) {
    for (uVar20 = 0;
        uVar20 < (ulong)((long)child_expressions.
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)child_expressions.
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&child_expressions,uVar20);
      expr_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_01);
      GetExpressionReturnType(&child_type,expr_02);
      pBVar16 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                              *)&local_210);
      pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar16->types,uVar20);
      LogicalType::LogicalType(&compare_type);
      bVar10 = LogicalType::TryGetMaxLogicalType(this->context,&child_type,pvVar17,&compare_type);
      if (!bVar10) {
        pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&corr,
                   "Cannot compare values of type %s and %s in IN/ANY/ALL clause - an explicit cast is required"
                   ,&local_211);
        LogicalType::ToString_abi_cxx11_(&local_e8,&child_type);
        LogicalType::LogicalType(&local_100,pvVar17);
        BinderException::BinderException<std::__cxx11::string,duckdb::LogicalType>
                  (pBVar19,&local_220->super_ParsedExpression,(string *)&corr,&local_e8,&local_100);
        __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      context = this->context;
      local_1e0._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&corr,context,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_1e0,&compare_type,false);
      iVar9 = corr.binding.table_index;
      corr.binding.table_index = 0;
      _Var5._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)iVar9;
      if (_Var5._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
      }
      if (corr.binding.table_index != 0) {
        (**(code **)(*(long *)corr.binding.table_index + 8))();
      }
      corr.binding.table_index = 0;
      if (local_1e0._M_head_impl != (Expression *)0x0) {
        (*((local_1e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_1e0._M_head_impl = (Expression *)0x0;
      pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_228);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pBVar18->child_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pvVar17);
      pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_228);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pBVar18->child_targets).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &compare_type);
      pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                              *)&local_228);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar18->children,this_01);
      LogicalType::~LogicalType(&compare_type);
      LogicalType::~LogicalType(&child_type);
    }
  }
  pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_228);
  shared_ptr<duckdb::Binder,_true>::operator=(&pBVar18->binder,&local_198);
  pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_228);
  _Var7._M_head_impl = local_210._M_head_impl;
  local_210._M_head_impl = (BoundQueryNode *)0x0;
  _Var6._M_head_impl =
       (pBVar18->subquery).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar18->subquery).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (BoundQueryNode *)0x0) {
    (**(code **)((long)(_Var6._M_head_impl)->_vptr_BoundQueryNode + 8))();
  }
  SVar1 = local_220->subquery_type;
  pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_228);
  pBVar18->subquery_type = SVar1;
  EVar2 = local_220->comparison_type;
  pBVar18 = unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryExpression,_std::default_delete<duckdb::BoundSubqueryExpression>,_true>
                          *)&local_228);
  local_1d8._M_head_impl = &(local_228._M_head_impl)->super_Expression;
  pBVar18->comparison_type = EVar2;
  local_228._M_head_impl = (BoundSubqueryExpression *)0x0;
  BindResult::BindResult
            (local_1d0,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1d8);
  if ((BoundSubqueryExpression *)local_1d8._M_head_impl != (BoundSubqueryExpression *)0x0) {
    (*(((Expression *)&(local_1d8._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_1d8._M_head_impl = (Expression *)0x0;
  if (local_228._M_head_impl != (BoundSubqueryExpression *)0x0) {
    (*((local_228._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  LogicalType::~LogicalType(&return_type);
  if (local_210._M_head_impl != (BoundQueryNode *)0x0) {
    (*(local_210._M_head_impl)->_vptr_BoundQueryNode[1])();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&child_expressions);
  return local_1d0;
}

Assistant:

BindResult ExpressionBinder::BindExpression(SubqueryExpression &expr, idx_t depth) {
	if (expr.subquery->node->type != QueryNodeType::BOUND_SUBQUERY_NODE) {
		// first bind the actual subquery in a new binder
		auto subquery_binder = Binder::CreateBinder(context, &binder);
		subquery_binder->can_contain_nulls = true;
		auto bound_node = subquery_binder->BindNode(*expr.subquery->node);
		// check the correlated columns of the subquery for correlated columns with depth > 1
		for (idx_t i = 0; i < subquery_binder->correlated_columns.size(); i++) {
			CorrelatedColumnInfo corr = subquery_binder->correlated_columns[i];
			if (corr.depth > 1) {
				// depth > 1, the column references the query ABOVE the current one
				// add to the set of correlated columns for THIS query
				corr.depth -= 1;
				binder.AddCorrelatedColumn(corr);
			}
		}
		auto prior_subquery = std::move(expr.subquery);
		expr.subquery = make_uniq<SelectStatement>();
		expr.subquery->node =
		    make_uniq<BoundSubqueryNode>(std::move(subquery_binder), std::move(bound_node), std::move(prior_subquery));
	}
	// now bind the child node of the subquery
	if (expr.child) {
		// first bind the children of the subquery, if any
		auto error = Bind(expr.child, depth);
		if (error.HasError()) {
			return BindResult(std::move(error));
		}
	}
	auto &bound_subquery = expr.subquery->node->Cast<BoundSubqueryNode>();
	vector<unique_ptr<Expression>> child_expressions;
	if (expr.subquery_type != SubqueryType::EXISTS) {
		idx_t expected_columns = 1;
		if (expr.child) {
			auto &child = BoundExpression::GetExpression(*expr.child);
			ExtractSubqueryChildren(child, child_expressions, bound_subquery.bound_node->types);
			if (child_expressions.empty()) {
				child_expressions.push_back(std::move(child));
			}
			expected_columns = child_expressions.size();
		}
		if (bound_subquery.bound_node->types.size() != expected_columns) {
			throw BinderException(expr, "Subquery returns %zu columns - expected %d",
			                      bound_subquery.bound_node->types.size(), expected_columns);
		}
	}
	// both binding the child and binding the subquery was successful
	D_ASSERT(expr.subquery->node->type == QueryNodeType::BOUND_SUBQUERY_NODE);
	auto subquery_binder = std::move(bound_subquery.subquery_binder);
	auto bound_node = std::move(bound_subquery.bound_node);
	LogicalType return_type =
	    expr.subquery_type == SubqueryType::SCALAR ? bound_node->types[0] : LogicalType(LogicalTypeId::BOOLEAN);
	if (return_type.id() == LogicalTypeId::UNKNOWN) {
		return_type = LogicalType::SQLNULL;
	}

	auto result = make_uniq<BoundSubqueryExpression>(return_type);
	if (expr.subquery_type == SubqueryType::ANY) {
		// ANY comparison
		// cast child and subquery child to equivalent types
		for (idx_t child_idx = 0; child_idx < child_expressions.size(); child_idx++) {
			auto &child = child_expressions[child_idx];
			auto child_type = ExpressionBinder::GetExpressionReturnType(*child);
			auto &subquery_type = bound_node->types[child_idx];
			LogicalType compare_type;
			if (!LogicalType::TryGetMaxLogicalType(context, child_type, subquery_type, compare_type)) {
				throw BinderException(
				    expr, "Cannot compare values of type %s and %s in IN/ANY/ALL clause - an explicit cast is required",
				    child_type.ToString(), subquery_type);
			}
			child = BoundCastExpression::AddCastToType(context, std::move(child), compare_type);
			result->child_types.push_back(subquery_type);
			result->child_targets.push_back(compare_type);
			result->children.push_back(std::move(child));
		}
	}
	result->binder = std::move(subquery_binder);
	result->subquery = std::move(bound_node);
	result->subquery_type = expr.subquery_type;
	result->comparison_type = expr.comparison_type;

	return BindResult(std::move(result));
}